

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int editPage(MemPage *pPg,int iOld,int iNew,int nNew,CellArray *pCArray)

{
  byte bVar1;
  u16 uVar2;
  ushort uVar3;
  int iVar4;
  u8 *pBegin;
  u16 *puVar5;
  uint uVar6;
  uint uVar7;
  int nCell;
  u8 *puVar8;
  int iFirst;
  long lVar9;
  int iVar10;
  ulong uVar11;
  long lVar12;
  u8 *pData;
  u8 *local_50;
  long local_48;
  ulong local_40;
  u8 *local_38;
  
  local_38 = pPg->aData;
  local_40 = (ulong)pPg->hdrOffset;
  pBegin = pPg->aCellIdx + nNew * 2;
  uVar3 = pPg->nCell;
  uVar7 = (uint)uVar3;
  bVar1 = pPg->nOverflow;
  iVar10 = iOld - iNew;
  uVar6 = uVar7;
  if (iOld < iNew) {
    local_48 = CONCAT44(local_48._4_4_,iOld);
    iVar4 = pageFreeArray(pPg,iOld,iNew - iOld,pCArray);
    uVar6 = (uint)uVar3 - iVar4;
    if ((int)(uint)uVar3 < iVar4) {
      sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x12293,
                  "4635f4a69c8c2a8df242b384a992aea71224e39a2ccab42d8c0b0602f1e826e8");
      return 0xb;
    }
    memmove(pPg->aCellIdx,pPg->aCellIdx + iVar4 * 2,(ulong)(uVar7 * 2));
    iOld = (int)local_48;
  }
  iVar4 = uVar7 + iOld + (uint)bVar1;
  iFirst = nNew + iNew;
  nCell = iVar4 - iFirst;
  if (nCell != 0 && iFirst <= iVar4) {
    iVar4 = pageFreeArray(pPg,iFirst,nCell,pCArray);
    uVar6 = uVar6 - iVar4;
  }
  local_50 = local_38 +
             (ulong)((ushort)(*(ushort *)(local_38 + local_40 + 5) << 8 |
                             *(ushort *)(local_38 + local_40 + 5) >> 8) - 1 & 0xffff) + 1;
  if ((pBegin <= local_50) && (local_50 <= pPg->aDataEnd)) {
    if (iNew < iOld) {
      if (nNew <= iVar10) {
        iVar10 = nNew;
      }
      puVar8 = pPg->aCellIdx;
      memmove(puVar8 + iVar10 * 2,puVar8,(long)(int)(uVar6 * 2));
      iVar4 = pageInsertArray(pPg,pBegin,&local_50,puVar8,iNew,iVar10,pCArray);
      if (iVar4 != 0) goto LAB_0014a36e;
      uVar6 = uVar6 + iVar10;
    }
    bVar1 = pPg->nOverflow;
    if (bVar1 != 0) {
      uVar11 = 0;
      lVar9 = (long)iOld;
      local_48 = lVar9;
      do {
        lVar12 = (ulong)pPg->aiOvfl[uVar11] + lVar9;
        iVar4 = (int)lVar12;
        iVar10 = iVar4 - iNew;
        if (iVar10 < nNew && -1 < iVar10) {
          puVar8 = pPg->aCellIdx + (uint)(iVar10 * 2);
          if (uVar6 - iVar10 != 0 && iVar10 <= (int)uVar6) {
            memmove(puVar8 + 2,puVar8,(long)(int)((uVar6 - iVar10) * 2));
          }
          if (pCArray->szCell[lVar12] == 0) {
            computeCellSize(pCArray,iVar4);
          }
          iVar10 = pageInsertArray(pPg,pBegin,&local_50,puVar8,iVar4,1,pCArray);
          if (iVar10 != 0) goto LAB_0014a36e;
          uVar6 = uVar6 + 1;
          bVar1 = pPg->nOverflow;
          lVar9 = local_48;
        }
        uVar11 = uVar11 + 1;
      } while (uVar11 < bVar1);
    }
    iVar10 = pageInsertArray(pPg,pBegin,&local_50,pPg->aCellIdx + (int)(uVar6 * 2),uVar6 + iNew,
                             nNew - uVar6,pCArray);
    if (iVar10 == 0) {
      pPg->nCell = (u16)nNew;
      pPg->nOverflow = '\0';
      local_38[local_40 + 3] = (u8)((uint)nNew >> 8);
      local_38[local_40 + 4] = (u8)pPg->nCell;
      uVar3 = (short)local_50 - (short)local_38;
      *(ushort *)(local_38 + local_40 + 5) = uVar3 * 0x100 | uVar3 >> 8;
      return 0;
    }
  }
LAB_0014a36e:
  if (0 < nNew) {
    puVar5 = pCArray->szCell;
    lVar9 = (long)iNew * 2;
    iVar10 = nNew + 1;
    do {
      if (*(short *)((long)puVar5 + lVar9) == 0) {
        uVar2 = (*pCArray->pRef->xCellSize)
                          (pCArray->pRef,*(u8 **)((long)pCArray->apCell + lVar9 * 4));
        puVar5 = pCArray->szCell;
        *(u16 *)((long)puVar5 + lVar9) = uVar2;
      }
      lVar9 = lVar9 + 2;
      iVar10 = iVar10 + -1;
    } while (1 < iVar10);
  }
  iVar10 = rebuildPage(pCArray,iNew,nNew,pPg);
  return iVar10;
}

Assistant:

static int editPage(
  MemPage *pPg,                   /* Edit this page */
  int iOld,                       /* Index of first cell currently on page */
  int iNew,                       /* Index of new first cell on page */
  int nNew,                       /* Final number of cells on page */
  CellArray *pCArray              /* Array of cells and sizes */
){
  u8 * const aData = pPg->aData;
  const int hdr = pPg->hdrOffset;
  u8 *pBegin = &pPg->aCellIdx[nNew * 2];
  int nCell = pPg->nCell;       /* Cells stored on pPg */
  u8 *pData;
  u8 *pCellptr;
  int i;
  int iOldEnd = iOld + pPg->nCell + pPg->nOverflow;
  int iNewEnd = iNew + nNew;

#ifdef SQLITE_DEBUG
  u8 *pTmp = sqlite3PagerTempSpace(pPg->pBt->pPager);
  memcpy(pTmp, aData, pPg->pBt->usableSize);
#endif

  /* Remove cells from the start and end of the page */
  assert( nCell>=0 );
  if( iOld<iNew ){
    int nShift = pageFreeArray(pPg, iOld, iNew-iOld, pCArray);
    if( NEVER(nShift>nCell) ) return SQLITE_CORRUPT_BKPT;
    memmove(pPg->aCellIdx, &pPg->aCellIdx[nShift*2], nCell*2);
    nCell -= nShift;
  }
  if( iNewEnd < iOldEnd ){
    int nTail = pageFreeArray(pPg, iNewEnd, iOldEnd - iNewEnd, pCArray);
    assert( nCell>=nTail );
    nCell -= nTail;
  }

  pData = &aData[get2byteNotZero(&aData[hdr+5])];
  if( pData<pBegin ) goto editpage_fail;
  if( pData>pPg->aDataEnd ) goto editpage_fail;

  /* Add cells to the start of the page */
  if( iNew<iOld ){
    int nAdd = MIN(nNew,iOld-iNew);
    assert( (iOld-iNew)<nNew || nCell==0 || CORRUPT_DB );
    assert( nAdd>=0 );
    pCellptr = pPg->aCellIdx;
    memmove(&pCellptr[nAdd*2], pCellptr, nCell*2);
    if( pageInsertArray(
          pPg, pBegin, &pData, pCellptr,
          iNew, nAdd, pCArray
    ) ) goto editpage_fail;
    nCell += nAdd;
  }

  /* Add any overflow cells */
  for(i=0; i<pPg->nOverflow; i++){
    int iCell = (iOld + pPg->aiOvfl[i]) - iNew;
    if( iCell>=0 && iCell<nNew ){
      pCellptr = &pPg->aCellIdx[iCell * 2];
      if( nCell>iCell ){
        memmove(&pCellptr[2], pCellptr, (nCell - iCell) * 2);
      }
      nCell++;
      cachedCellSize(pCArray, iCell+iNew);
      if( pageInsertArray(
            pPg, pBegin, &pData, pCellptr,
            iCell+iNew, 1, pCArray
      ) ) goto editpage_fail;
    }
  }

  /* Append cells to the end of the page */
  assert( nCell>=0 );
  pCellptr = &pPg->aCellIdx[nCell*2];
  if( pageInsertArray(
        pPg, pBegin, &pData, pCellptr,
        iNew+nCell, nNew-nCell, pCArray
  ) ) goto editpage_fail;

  pPg->nCell = nNew;
  pPg->nOverflow = 0;

  put2byte(&aData[hdr+3], pPg->nCell);
  put2byte(&aData[hdr+5], pData - aData);

#ifdef SQLITE_DEBUG
  for(i=0; i<nNew && !CORRUPT_DB; i++){
    u8 *pCell = pCArray->apCell[i+iNew];
    int iOff = get2byteAligned(&pPg->aCellIdx[i*2]);
    if( SQLITE_WITHIN(pCell, aData, &aData[pPg->pBt->usableSize]) ){
      pCell = &pTmp[pCell - aData];
    }
    assert( 0==memcmp(pCell, &aData[iOff],
            pCArray->pRef->xCellSize(pCArray->pRef, pCArray->apCell[i+iNew])) );
  }
#endif

  return SQLITE_OK;
 editpage_fail:
  /* Unable to edit this page. Rebuild it from scratch instead. */
  populateCellCache(pCArray, iNew, nNew);
  return rebuildPage(pCArray, iNew, nNew, pPg);
}